

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper.cpp
# Opt level: O3

void __thiscall CDBWrapper::~CDBWrapper(CDBWrapper *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  DB *pDVar3;
  FilterPolicy *pFVar4;
  Logger *pLVar5;
  Cache *pCVar6;
  Env *pEVar7;
  pointer puVar8;
  pointer pcVar9;
  _Head_base<0UL,_LevelDBContext_*,_false> _Var10;
  unique_ptr<LevelDBContext,_std::default_delete<LevelDBContext>_> *puVar11;
  pointer *__ptr;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  puVar11 = inline_assertion_check<true,std::unique_ptr<LevelDBContext,std::default_delete<LevelDBContext>>const&>
                      (&this->m_db_context,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/dbwrapper.h"
                       ,0xd3,"DBContext","m_db_context");
  pDVar3 = ((puVar11->_M_t).
            super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>._M_t.
            super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
            super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl)->pdb;
  if (pDVar3 != (DB *)0x0) {
    (*pDVar3->_vptr_DB[1])();
  }
  puVar11 = inline_assertion_check<true,std::unique_ptr<LevelDBContext,std::default_delete<LevelDBContext>>const&>
                      (&this->m_db_context,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/dbwrapper.h"
                       ,0xd3,"DBContext","m_db_context");
  ((puVar11->_M_t).super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>._M_t.
   super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
   super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl)->pdb = (DB *)0x0;
  puVar11 = inline_assertion_check<true,std::unique_ptr<LevelDBContext,std::default_delete<LevelDBContext>>const&>
                      (&this->m_db_context,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/dbwrapper.h"
                       ,0xd3,"DBContext","m_db_context");
  pFVar4 = (((puVar11->_M_t).
             super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>._M_t.
             super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
             super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl)->options).filter_policy;
  if (pFVar4 != (FilterPolicy *)0x0) {
    (*pFVar4->_vptr_FilterPolicy[1])();
  }
  puVar11 = inline_assertion_check<true,std::unique_ptr<LevelDBContext,std::default_delete<LevelDBContext>>const&>
                      (&this->m_db_context,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/dbwrapper.h"
                       ,0xd3,"DBContext","m_db_context");
  (((puVar11->_M_t).super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>._M_t
    .super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
    super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl)->options).filter_policy =
       (FilterPolicy *)0x0;
  puVar11 = inline_assertion_check<true,std::unique_ptr<LevelDBContext,std::default_delete<LevelDBContext>>const&>
                      (&this->m_db_context,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/dbwrapper.h"
                       ,0xd3,"DBContext","m_db_context");
  pLVar5 = (((puVar11->_M_t).
             super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>._M_t.
             super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
             super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl)->options).info_log;
  if (pLVar5 != (Logger *)0x0) {
    (*pLVar5->_vptr_Logger[1])();
  }
  puVar11 = inline_assertion_check<true,std::unique_ptr<LevelDBContext,std::default_delete<LevelDBContext>>const&>
                      (&this->m_db_context,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/dbwrapper.h"
                       ,0xd3,"DBContext","m_db_context");
  (((puVar11->_M_t).super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>._M_t
    .super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
    super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl)->options).info_log = (Logger *)0x0;
  puVar11 = inline_assertion_check<true,std::unique_ptr<LevelDBContext,std::default_delete<LevelDBContext>>const&>
                      (&this->m_db_context,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/dbwrapper.h"
                       ,0xd3,"DBContext","m_db_context");
  pCVar6 = (((puVar11->_M_t).
             super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>._M_t.
             super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
             super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl)->options).block_cache;
  if (pCVar6 != (Cache *)0x0) {
    (*pCVar6->_vptr_Cache[1])();
  }
  puVar11 = inline_assertion_check<true,std::unique_ptr<LevelDBContext,std::default_delete<LevelDBContext>>const&>
                      (&this->m_db_context,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/dbwrapper.h"
                       ,0xd3,"DBContext","m_db_context");
  (((puVar11->_M_t).super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>._M_t
    .super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
    super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl)->options).block_cache =
       (Cache *)0x0;
  puVar11 = inline_assertion_check<true,std::unique_ptr<LevelDBContext,std::default_delete<LevelDBContext>>const&>
                      (&this->m_db_context,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/dbwrapper.h"
                       ,0xd3,"DBContext","m_db_context");
  pEVar7 = ((puVar11->_M_t).
            super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>._M_t.
            super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
            super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl)->penv;
  if (pEVar7 != (Env *)0x0) {
    (*pEVar7->_vptr_Env[1])();
  }
  puVar11 = inline_assertion_check<true,std::unique_ptr<LevelDBContext,std::default_delete<LevelDBContext>>const&>
                      (&this->m_db_context,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/dbwrapper.h"
                       ,0xd3,"DBContext","m_db_context");
  (((puVar11->_M_t).super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>._M_t
    .super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
    super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl)->options).env = (Env *)0x0;
  std::filesystem::__cxx11::path::~path(&(this->m_path).super_path);
  puVar8 = (this->obfuscate_key).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar8 != (pointer)0x0) {
    operator_delete(puVar8,(long)(this->obfuscate_key).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar8);
  }
  pcVar9 = (this->m_name)._M_dataplus._M_p;
  paVar1 = &(this->m_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar9 != paVar1) {
    operator_delete(pcVar9,paVar1->_M_allocated_capacity + 1);
  }
  _Var10._M_head_impl =
       (this->m_db_context)._M_t.
       super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>._M_t.
       super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
       super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl;
  if (_Var10._M_head_impl != (LevelDBContext *)0x0) {
    operator_delete(_Var10._M_head_impl,0x98);
  }
  (this->m_db_context)._M_t.
  super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>._M_t.
  super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
  super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl = (LevelDBContext *)0x0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CDBWrapper::~CDBWrapper()
{
    delete DBContext().pdb;
    DBContext().pdb = nullptr;
    delete DBContext().options.filter_policy;
    DBContext().options.filter_policy = nullptr;
    delete DBContext().options.info_log;
    DBContext().options.info_log = nullptr;
    delete DBContext().options.block_cache;
    DBContext().options.block_cache = nullptr;
    delete DBContext().penv;
    DBContext().options.env = nullptr;
}